

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnElemSegmentElemExpr_RefFunc
          (BinaryReaderIR *this,Index segment_index,Index func_index)

{
  pointer ppEVar1;
  ElemSegment *pEVar2;
  char *__s;
  Offset OVar3;
  size_t sVar4;
  Location loc;
  Location local_98;
  Var local_70;
  
  ppEVar1 = (this->module_->elem_segments).
            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((long)(this->module_->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3) - 1U == (ulong)segment_index) {
    pEVar2 = ppEVar1[segment_index];
    local_98.field_1.field_0.line = 0;
    local_98.field_1.field_0.first_column = 0;
    local_98.field_1.field_0.last_column = 0;
    local_98.filename.data_ = (char *)0x0;
    local_98.filename.size_._0_4_ = 0;
    local_98.filename.size_._4_4_ = 0;
    __s = this->filename_;
    sVar4 = strlen(__s);
    local_98.filename.size_._0_4_ = (undefined4)sVar4;
    local_98.filename.size_._4_4_ = (undefined4)(sVar4 >> 0x20);
    OVar3 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
    local_98.field_1.field_0.line = (int)OVar3;
    local_98.field_1.field_0.first_column = (int)(OVar3 >> 0x20);
    local_98.filename.data_ = __s;
    Var::Var(&local_70,func_index,&local_98);
    std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::emplace_back<wabt::Var>
              (&pEVar2->elem_exprs,&local_70);
    Var::~Var(&local_70);
    return (Result)Ok;
  }
  __assert_fail("segment_index == module_->elem_segments.size() - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/binary-reader-ir.cc"
                ,0x443,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnElemSegmentElemExpr_RefFunc(Index, Index)"
               );
}

Assistant:

Result BinaryReaderIR::OnElemSegmentElemExpr_RefFunc(Index segment_index,
                                                     Index func_index) {
  assert(segment_index == module_->elem_segments.size() - 1);
  ElemSegment* segment = module_->elem_segments[segment_index];
  segment->elem_exprs.emplace_back(Var(func_index, GetLocation()));
  return Result::Ok;
}